

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O2

pString string_from_array(char *str,size_t len)

{
  pString pSVar1;
  
  pSVar1 = string_allocate_memory(len);
  if (pSVar1 == (pString)0x0) {
    puts("string_from_array: string_allocate_memory failed");
  }
  else {
    memcpy(pSVar1->buf,str,len);
  }
  return pSVar1;
}

Assistant:

pString string_from_array(char *str, size_t len)
{
    pString res = string_allocate_memory(len);
    if (res == NULL)
    {
        log("string_from_array: string_allocate_memory failed");
        return NULL;
    }
    string_copy_chars(res->buf, str, len);
    return res;
}